

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_options.h
# Opt level: O2

bool __thiscall
draco::DracoOptions<int>::IsAttributeOptionSet
          (DracoOptions<int> *this,AttributeKey *att_key,string *name)

{
  bool bVar1;
  DracoOptions<int> *pDVar2;
  
  pDVar2 = (DracoOptions<int> *)FindAttributeOptions(this,att_key);
  if (pDVar2 != (DracoOptions<int> *)0x0) {
    this = pDVar2;
  }
  bVar1 = Options::IsOptionSet(&this->global_options_,name);
  return bVar1;
}

Assistant:

bool DracoOptions<AttributeKeyT>::IsAttributeOptionSet(
    const AttributeKey &att_key, const std::string &name) const {
  const Options *const att_options = FindAttributeOptions(att_key);
  if (att_options) {
    return att_options->IsOptionSet(name);
  }
  return global_options_.IsOptionSet(name);
}